

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O2

int __thiscall MeCab::Param::help_version(Param *this)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = get<bool>(this,"help");
  if (bVar1) {
    lVar2 = 0x70;
  }
  else {
    bVar1 = get<bool>(this,"version");
    lVar2 = 0x90;
    if (!bVar1) {
      return 1;
    }
  }
  std::operator<<((ostream *)&std::cout,*(char **)((long)&this->_vptr_Param + lVar2));
  return 0;
}

Assistant:

int Param::help_version() const {
  if (get<bool>("help")) {
    std::cout << help();
    return 0;
  }

  if (get<bool>("version")) {
    std::cout << version();
    return 0;
  }

  return 1;
}